

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void timeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined1 *puStack_40;
  double local_38;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = -NAN;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  iVar1 = isDate(context,argc,argv,(DateTime *)local_58);
  if (iVar1 == 0) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    computeHMS((DateTime *)local_58);
    if (((ulong)local_30 & 0x400000000) == 0) {
      iVar2 = (int)local_38;
      iVar1 = iVar2 / 10;
      iVar3 = 8;
      uVar4 = 0;
    }
    else {
      iVar3 = (int)(local_38 * 1000.0 + 0.5);
      iVar1 = iVar3 / 10000;
      iVar2 = iVar3 / 1000;
      puStack_20._0_5_ =
           (uint5)CONCAT12((char)(iVar3 % 10) + '0',
                           CONCAT11((char)((long)((ulong)(uint)((int)((long)iVar3 / 10) >> 0x1f) <<
                                                  0x20 | (long)iVar3 / 10 & 0xffffffffU) % 10) + '0'
                                    ,(char)((long)((ulong)(uint)((int)((long)iVar3 / 100) >> 0x1f)
                                                   << 0x20 | (long)iVar3 / 100 & 0xffffffffU) % 10)
                                     + '0')) << 8;
      iVar3 = 0xc;
      uVar4 = 0x2e;
    }
    local_28 = (undefined1 *)
               CONCAT17((char)(iVar2 % 10) + '0',
                        CONCAT16((char)(iVar1 % 10) + '0',
                                 CONCAT15(0x3a,CONCAT14((char)((int)puStack_40 % 10) + '0',
                                                        CONCAT13((char)((long)((ulong)(uint)((int)((
                                                  long)(int)puStack_40 / 10) >> 0x1f) << 0x20 |
                                                  (long)(int)puStack_40 / 10 & 0xffffffffU) % 10) +
                                                  '0',CONCAT12(0x3a,CONCAT11((char)(local_48._4_4_ %
                                                                                   10) + '0',
                                                                             (char)((long)((ulong)(
                                                  uint)((int)((long)local_48._4_4_ / 10) >> 0x1f) <<
                                                  0x20 | (long)local_48._4_4_ / 10 & 0xffffffffU) %
                                                  10) + '0')))))));
    puStack_20 = (undefined1 *)CONCAT71(puStack_20._1_7_,uVar4);
    sqlite3_result_text(context,(char *)&local_28,iVar3,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void timeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int s, n;
    char zBuf[16];
    computeHMS(&x);
    zBuf[0] = '0' + (x.h/10)%10;
    zBuf[1] = '0' + (x.h)%10;
    zBuf[2] = ':';
    zBuf[3] = '0' + (x.m/10)%10;
    zBuf[4] = '0' + (x.m)%10;
    zBuf[5] = ':';
    if( x.useSubsec ){
      s = (int)(1000.0*x.s + 0.5);
      zBuf[6] = '0' + (s/10000)%10;
      zBuf[7] = '0' + (s/1000)%10;
      zBuf[8] = '.';
      zBuf[9] = '0' + (s/100)%10;
      zBuf[10] = '0' + (s/10)%10;
      zBuf[11] = '0' + (s)%10;
      zBuf[12] = 0;
      n = 12;
    }else{
      s = (int)x.s;
      zBuf[6] = '0' + (s/10)%10;
      zBuf[7] = '0' + (s)%10;
      zBuf[8] = 0;
      n = 8;
    }
    sqlite3_result_text(context, zBuf, n, SQLITE_TRANSIENT);
  }
}